

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ArenaStringPtr::Destroy
          (ArenaStringPtr *this,string *default_value,Arena *arena)

{
  bool bVar1;
  string *this_00;
  long in_RDX;
  ArenaStringPtr *in_stack_00000030;
  string *in_stack_ffffffffffffff78;
  ArenaStringPtr *in_stack_ffffffffffffff80;
  
  if (((in_RDX == 0) &&
      (bVar1 = IsDefault(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78), !bVar1)) &&
     (this_00 = UnsafeMutablePointer_abi_cxx11_(in_stack_00000030), this_00 != (string *)0x0)) {
    std::__cxx11::string::~string((string *)this_00);
    operator_delete(this_00,0x20);
  }
  return;
}

Assistant:

void ArenaStringPtr::Destroy(const std::string* default_value,
                             ::google::protobuf::Arena* arena) {
  if (arena == nullptr) {
    GOOGLE_DCHECK(!IsDonatedString());
    if (!IsDefault(default_value)) {
      delete UnsafeMutablePointer();
    }
  }
}